

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtoolbararealayout.cpp
# Opt level: O2

void __thiscall QToolBarAreaLayout::QToolBarAreaLayout(QToolBarAreaLayout *this,QMainWindow *win)

{
  undefined8 *puVar1;
  long lVar2;
  QToolBarAreaLayoutInfo *this_00;
  int i;
  long in_FS_OFFSET;
  QToolBarAreaLayoutInfo QStack_58;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  (this->rect).x1 = 0;
  (this->rect).y1 = 0;
  (this->rect).x2 = -1;
  (this->rect).y2 = -1;
  this->mainWindow = win;
  lVar2 = 0;
  do {
    puVar1 = (undefined8 *)((long)&this->docks[0].lines.d.size + lVar2);
    *puVar1 = 0;
    puVar1[1] = 0;
    puVar1 = (undefined8 *)((long)&this->docks[0].lines.d.d + lVar2);
    *puVar1 = 0;
    puVar1[1] = 0;
    puVar1 = (undefined8 *)((long)&this->docks[0].rect.x2.m_i + lVar2);
    *puVar1 = 0xffffffffffffffff;
    puVar1[1] = 0x200000001;
    (&this->docks[0].dirty)[lVar2] = false;
    lVar2 = lVar2 + 0x38;
  } while (lVar2 != 0xe0);
  this->visible = true;
  this_00 = this->docks;
  for (lVar2 = 0; lVar2 != 4; lVar2 = lVar2 + 1) {
    QToolBarAreaLayoutInfo::QToolBarAreaLayoutInfo(&QStack_58,(DockPosition)lVar2);
    QToolBarAreaLayoutInfo::operator=(this_00,&QStack_58);
    QArrayDataPointer<QToolBarAreaLayoutLine>::~QArrayDataPointer
              ((QArrayDataPointer<QToolBarAreaLayoutLine> *)&QStack_58);
    this_00 = this_00 + 1;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

QToolBarAreaLayout::QToolBarAreaLayout(const QMainWindow *win) : mainWindow(win), visible(true)
{
    for (int i = 0; i < QInternal::DockCount; ++i) {
        QInternal::DockPosition pos = static_cast<QInternal::DockPosition>(i);
        docks[i] = QToolBarAreaLayoutInfo(pos);
    }
}